

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::IsAppBundleOnApple(cmTarget *this)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  bool bVar2;
  allocator<char> local_31;
  string local_30;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (((_Var1._M_head_impl)->TargetType == 0) && ((_Var1._M_head_impl)->IsApple == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"MACOSX_BUNDLE",&local_31);
    bVar2 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

FileSetEntries(cm::static_string_view propertyName)
    : PropertyName(propertyName)
  {
  }